

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O2

void __thiscall sjtu::UserManager::~UserManager(UserManager *this)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  ofstream outfile;
  
  if (this->UserFile != (FileManager<sjtu::userType> *)0x0) {
    (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[5])();
  }
  this_00 = this->UserBpTree;
  if (this_00 != (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x0) {
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::~BplusTree(this_00);
  }
  operator_delete(this_00,0x18);
  std::ofstream::ofstream(&outfile,"OnlineFlag.dat",_S_out|_S_bin);
  std::ostream::write((char *)&outfile,(long)&this->online_flag);
  std::ofstream::close();
  std::ofstream::~ofstream(&outfile);
  return;
}

Assistant:

~UserManager() {
            delete UserFile;
            delete UserBpTree;
            	std::ofstream outfile("OnlineFlag.dat" , std::ios_base::out | std::ios_base::binary);
            	outfile.write(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	outfile.close();
        }